

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void icu_63::ICU_Utility::appendToRule
               (UnicodeString *rule,UChar32 c,UBool isLiteral,UBool escapeUnprintable,
               UnicodeString *quoteBuf)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  UnicodeString *pUVar4;
  __off_t __length;
  __off_t __length_00;
  bool bVar5;
  int local_24;
  int32_t len;
  int32_t trailingCount;
  UnicodeString *quoteBuf_local;
  UBool escapeUnprintable_local;
  UBool isLiteral_local;
  UChar32 c_local;
  UnicodeString *rule_local;
  
  if ((isLiteral == '\0') &&
     ((escapeUnprintable == '\0' || (UVar1 = isUnprintable(c), UVar1 == '\0')))) {
    iVar3 = UnicodeString::length(quoteBuf);
    if ((iVar3 == 0) && ((c == 0x27 || (c == 0x5c)))) {
      UnicodeString::append(rule,L'\\');
      UnicodeString::append(rule,c);
    }
    else {
      iVar3 = UnicodeString::length(quoteBuf);
      if (((iVar3 < 1) &&
          (((((c < 0x21 || (0x7e < c)) || ((0x2f < c && (c < 0x3a)))) || ((0x40 < c && (c < 0x5b))))
           || ((0x60 < c && (c < 0x7b)))))) &&
         (UVar1 = PatternProps::isWhiteSpace(c), UVar1 == '\0')) {
        UnicodeString::append(rule,c);
      }
      else {
        UnicodeString::append(quoteBuf,c);
        if (c == 0x27) {
          UnicodeString::append(quoteBuf,0x27);
        }
      }
    }
  }
  else {
    iVar3 = UnicodeString::length(quoteBuf);
    if (0 < iVar3) {
      while( true ) {
        iVar3 = UnicodeString::length(quoteBuf);
        bVar5 = false;
        if (1 < iVar3) {
          cVar2 = UnicodeString::charAt(quoteBuf,0);
          bVar5 = false;
          if (cVar2 == L'\'') {
            cVar2 = UnicodeString::charAt(quoteBuf,1);
            bVar5 = cVar2 == L'\'';
          }
        }
        if (!bVar5) break;
        pUVar4 = UnicodeString::append(rule,L'\\');
        UnicodeString::append(pUVar4,L'\'');
        UnicodeString::remove(quoteBuf,(char *)0x0);
      }
      local_24 = 0;
      while( true ) {
        iVar3 = UnicodeString::length(quoteBuf);
        bVar5 = false;
        if (1 < iVar3) {
          iVar3 = UnicodeString::length(quoteBuf);
          cVar2 = UnicodeString::charAt(quoteBuf,iVar3 + -2);
          bVar5 = false;
          if (cVar2 == L'\'') {
            iVar3 = UnicodeString::length(quoteBuf);
            cVar2 = UnicodeString::charAt(quoteBuf,iVar3 + -1);
            bVar5 = cVar2 == L'\'';
          }
        }
        if (!bVar5) break;
        iVar3 = UnicodeString::length(quoteBuf);
        UnicodeString::truncate(quoteBuf,(char *)(ulong)(iVar3 - 2),__length);
        local_24 = local_24 + 1;
      }
      iVar3 = UnicodeString::length(quoteBuf);
      if (0 < iVar3) {
        UnicodeString::append(rule,L'\'');
        UnicodeString::append(rule,quoteBuf);
        UnicodeString::append(rule,L'\'');
        UnicodeString::truncate(quoteBuf,(char *)0x0,__length_00);
      }
      while (0 < local_24) {
        pUVar4 = UnicodeString::append(rule,L'\\');
        UnicodeString::append(pUVar4,L'\'');
        local_24 = local_24 + -1;
      }
    }
    if (c != -1) {
      if (c == 0x20) {
        iVar3 = UnicodeString::length(rule);
        if ((0 < iVar3) && (cVar2 = UnicodeString::charAt(rule,iVar3 + -1), cVar2 != L' ')) {
          UnicodeString::append(rule,0x20);
        }
      }
      else if ((escapeUnprintable == '\0') ||
              (UVar1 = ICU_Utility::escapeUnprintable(rule,c), UVar1 == '\0')) {
        UnicodeString::append(rule,c);
      }
    }
  }
  return;
}

Assistant:

void ICU_Utility::appendToRule(UnicodeString& rule,
                               UChar32 c,
                               UBool isLiteral,
                               UBool escapeUnprintable,
                               UnicodeString& quoteBuf) {
    // If we are escaping unprintables, then escape them outside
    // quotes.  \u and \U are not recognized within quotes.  The same
    // logic applies to literals, but literals are never escaped.
    if (isLiteral ||
        (escapeUnprintable && ICU_Utility::isUnprintable(c))) {
        if (quoteBuf.length() > 0) {
            // We prefer backslash APOSTROPHE to double APOSTROPHE
            // (more readable, less similar to ") so if there are
            // double APOSTROPHEs at the ends, we pull them outside
            // of the quote.

            // If the first thing in the quoteBuf is APOSTROPHE
            // (doubled) then pull it out.
            while (quoteBuf.length() >= 2 &&
                   quoteBuf.charAt(0) == APOSTROPHE &&
                   quoteBuf.charAt(1) == APOSTROPHE) {
                rule.append(BACKSLASH).append(APOSTROPHE);
                quoteBuf.remove(0, 2);
            }
            // If the last thing in the quoteBuf is APOSTROPHE
            // (doubled) then remove and count it and add it after.
            int32_t trailingCount = 0;
            while (quoteBuf.length() >= 2 &&
                   quoteBuf.charAt(quoteBuf.length()-2) == APOSTROPHE &&
                   quoteBuf.charAt(quoteBuf.length()-1) == APOSTROPHE) {
                quoteBuf.truncate(quoteBuf.length()-2);
                ++trailingCount;
            }
            if (quoteBuf.length() > 0) {
                rule.append(APOSTROPHE);
                rule.append(quoteBuf);
                rule.append(APOSTROPHE);
                quoteBuf.truncate(0);
            }
            while (trailingCount-- > 0) {
                rule.append(BACKSLASH).append(APOSTROPHE);
            }
        }
        if (c != (UChar32)-1) {
            /* Since spaces are ignored during parsing, they are
             * emitted only for readability.  We emit one here
             * only if there isn't already one at the end of the
             * rule.
             */
            if (c == SPACE) {
                int32_t len = rule.length();
                if (len > 0 && rule.charAt(len-1) != c) {
                    rule.append(c);
                }
            } else if (!escapeUnprintable || !ICU_Utility::escapeUnprintable(rule, c)) {
                rule.append(c);
            }
        }
    }

    // Escape ' and '\' and don't begin a quote just for them
    else if (quoteBuf.length() == 0 &&
             (c == APOSTROPHE || c == BACKSLASH)) {
        rule.append(BACKSLASH);
        rule.append(c);
    }

    // Specials (printable ascii that isn't [0-9a-zA-Z]) and
    // whitespace need quoting.  Also append stuff to quotes if we are
    // building up a quoted substring already.
    else if (quoteBuf.length() > 0 ||
             (c >= 0x0021 && c <= 0x007E &&
              !((c >= 0x0030/*'0'*/ && c <= 0x0039/*'9'*/) ||
                (c >= 0x0041/*'A'*/ && c <= 0x005A/*'Z'*/) ||
                (c >= 0x0061/*'a'*/ && c <= 0x007A/*'z'*/))) ||
             PatternProps::isWhiteSpace(c)) {
        quoteBuf.append(c);
        // Double ' within a quote
        if (c == APOSTROPHE) {
            quoteBuf.append(c);
        }
    }
    
    // Otherwise just append
    else {
        rule.append(c);
    }
}